

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Int_t * Gia_ObjSimCands(Gia_SimRsbMan_t *p,int iObj,int nCands)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  Vec_Int_t *t;
  int iTemp;
  int i;
  int nCands_local;
  int iObj_local;
  Gia_SimRsbMan_t *p_local;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x239,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  pObj = Gia_ManObj(p->pGia,iObj);
  iVar3 = Gia_ObjIsAnd(pObj);
  if (iVar3 == 0) {
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x23a,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  Vec_IntClear(p->vCands);
  Vec_IntFill(p->vFanins,1,iObj);
  while( true ) {
    iVar3 = Vec_IntSize(p->vFanins);
    bVar2 = false;
    if (0 < iVar3) {
      iVar3 = Vec_IntSize(p->vCands);
      bVar2 = iVar3 < nCands;
    }
    if (!bVar2) break;
    for (t._4_4_ = 0; iVar3 = Vec_IntSize(p->vFanins), t._4_4_ < iVar3; t._4_4_ = t._4_4_ + 1) {
      iVar3 = Vec_IntEntry(p->vFanins,t._4_4_);
      Gia_ObjSetTravIdCurrentId(p->pGia,iVar3);
    }
    Gia_ObjSimCollect(p);
    Vec_IntAppend(p->vCands,p->vFanins2);
    pVVar1 = p->vFanins;
    p->vFanins = p->vFanins2;
    p->vFanins2 = pVVar1;
  }
  iVar3 = Vec_IntSize(p->vFanins);
  if ((iVar3 != 0) && (iVar3 = Vec_IntSize(p->vCands), iVar3 < nCands)) {
    __assert_fail("Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x246,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  iVar3 = Vec_IntSize(p->vCands);
  if (nCands < iVar3) {
    Vec_IntShrink(p->vCands,nCands);
  }
  return p->vCands;
}

Assistant:

Vec_Int_t * Gia_ObjSimCands( Gia_SimRsbMan_t * p, int iObj, int nCands )
{
    assert( iObj > 0 );
    assert( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj)) );
    Vec_IntClear( p->vCands );
    Vec_IntFill( p->vFanins, 1, iObj );
    while ( Vec_IntSize(p->vFanins) > 0 && Vec_IntSize(p->vCands) < nCands )
    {
        int i, iTemp;
        Vec_IntForEachEntry( p->vFanins, iTemp, i )
            Gia_ObjSetTravIdCurrentId( p->pGia, iTemp );
        Gia_ObjSimCollect( p ); // p->vFanins -> p->vFanins2
        Vec_IntAppend( p->vCands, p->vFanins2 );
        ABC_SWAP( Vec_Int_t *, p->vFanins, p->vFanins2 );
    }
    assert( Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands );
    if ( Vec_IntSize(p->vCands) > nCands )
        Vec_IntShrink( p->vCands, nCands );
    return p->vCands;
}